

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int binstrrcaseless(const_bstring b1,int pos,const_bstring b2)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *d1;
  uchar *d0;
  int local_30;
  int l;
  int i;
  int j;
  const_bstring b2_local;
  int pos_local;
  const_bstring b1_local;
  
  if ((((b1 == (const_bstring)0x0) || (b1->data == (uchar *)0x0)) || (b1->slen < 0)) ||
     (((b2 == (const_bstring)0x0 || (b2->data == (uchar *)0x0)) || (b2->slen < 0)))) {
    b1_local._4_4_ = -1;
  }
  else {
    b1_local._4_4_ = pos;
    if ((b1->slen != pos) || (b2->slen != 0)) {
      if ((b1->slen < pos) || (pos < 0)) {
        b1_local._4_4_ = -1;
      }
      else if (b2->slen != 0) {
        if (((b1->data == b2->data) && (pos == 0)) && (b2->slen <= b1->slen)) {
          b1_local._4_4_ = 0;
        }
        else {
          iVar3 = b1->slen - b2->slen;
          if (iVar3 < 0) {
            b1_local._4_4_ = -1;
          }
          else {
            local_30 = pos;
            if (iVar3 + 1 <= pos) {
              local_30 = iVar3;
            }
            l = 0;
            puVar1 = b2->data;
            puVar2 = b1->data;
            iVar3 = b2->slen;
LAB_00197251:
            do {
              if (puVar1[l] != puVar2[local_30 + l]) {
                iVar4 = tolower((uint)puVar1[l]);
                iVar5 = tolower((uint)puVar2[local_30 + l]);
                if (iVar4 != iVar5) {
                  local_30 = local_30 + -1;
                  if (local_30 < 0) {
                    return -1;
                  }
                  l = 0;
                  goto LAB_00197251;
                }
              }
              l = l + 1;
            } while (l < iVar3);
            b1_local._4_4_ = local_30;
          }
        }
      }
    }
  }
  return b1_local._4_4_;
}

Assistant:

int binstrrcaseless (const_bstring b1, int pos, const_bstring b2) {
int j, i, l;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos && b2->slen == 0) return pos;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	/* Obvious alias case */
	if (b1->data == b2->data && pos == 0 && b2->slen <= b1->slen)
		return BSTR_OK;

	i = pos;
	if ((l = b1->slen - b2->slen) < 0) return BSTR_ERR;

	/* If no space to find such a string then snap back */
	if (l + 1 <= i) i = l;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	l  = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j] || downcase (d0[j]) == downcase (d1[i + j])) {
			j ++;
			if (j >= l) return i;
		} else {
			i --;
			if (i < 0) break;
			j=0;
		}
	}

	return BSTR_ERR;
}